

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

void __thiscall Matrix4f::setCol(Matrix4f *this,int j,Vector4f *v)

{
  int iVar1;
  Vector4f *in_RDX;
  int in_ESI;
  long in_RDI;
  float fVar2;
  int colStart;
  
  iVar1 = in_ESI * 4;
  fVar2 = Vector4f::x(in_RDX);
  *(float *)(in_RDI + (long)iVar1 * 4) = fVar2;
  fVar2 = Vector4f::y(in_RDX);
  *(float *)(in_RDI + (long)(iVar1 + 1) * 4) = fVar2;
  fVar2 = Vector4f::z(in_RDX);
  *(float *)(in_RDI + (long)(iVar1 + 2) * 4) = fVar2;
  fVar2 = Vector4f::w(in_RDX);
  *(float *)(in_RDI + (long)(iVar1 + 3) * 4) = fVar2;
  return;
}

Assistant:

void Matrix4f::setCol( int j, const Vector4f& v )
{
	int colStart = 4 * j;

	m_elements[ colStart ] = v.x();
	m_elements[ colStart + 1 ] = v.y();
	m_elements[ colStart + 2 ] = v.z();
	m_elements[ colStart + 3 ] = v.w();
}